

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanohttp.c
# Opt level: O2

int xmlNanoHTTPSave(void *ctxt,char *filename)

{
  int __fd;
  ssize_t sVar1;
  int iVar2;
  char *buf;
  int len;
  
  buf = (char *)0x0;
  iVar2 = -1;
  if (filename != (char *)0x0 && ctxt != (void *)0x0) {
    if ((*filename == '-') && (filename[1] == '\0')) {
      __fd = 0;
    }
    else {
      __fd = open64(filename,0x41,0x1b6);
      if (__fd < 0) {
        xmlNanoHTTPClose(ctxt);
        return -1;
      }
    }
    xmlNanoHTTPFetchContent(ctxt,&buf,&len);
    if ((long)len < 1) {
      iVar2 = 0;
    }
    else {
      sVar1 = write(__fd,buf,(long)len);
      iVar2 = -(uint)(sVar1 == -1);
    }
    xmlNanoHTTPClose(ctxt);
    close(__fd);
  }
  return iVar2;
}

Assistant:

int
xmlNanoHTTPSave(void *ctxt, const char *filename) {
    char *buf = NULL;
    int fd;
    int len;
    int ret = 0;

    if ((ctxt == NULL) || (filename == NULL)) return(-1);

    if (!strcmp(filename, "-"))
        fd = 0;
    else {
        fd = open(filename, O_CREAT | O_WRONLY, 0666);
	if (fd < 0) {
	    xmlNanoHTTPClose(ctxt);
	    return(-1);
	}
    }

    xmlNanoHTTPFetchContent( ctxt, &buf, &len );
    if ( len > 0 ) {
	if (write(fd, buf, len) == -1) {
	    ret = -1;
	}
    }

    xmlNanoHTTPClose(ctxt);
    close(fd);
    return(ret);
}